

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.cxx
# Opt level: O0

bool __thiscall
cmLoadCommandCommand::InitialPass
          (cmLoadCommandCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  char *pcVar6;
  ostream *poVar7;
  SymbolPointer p_Var8;
  cmLoadedCommand *this_00;
  cmState *this_01;
  allocator local_411;
  string local_410;
  cmLoadedCommand *local_3f0;
  cmLoadedCommand *f;
  string local_3e0;
  allocator local_3b9;
  string local_3b8;
  SymbolPointer local_398;
  CM_INIT_FUNCTION initFunction;
  string initFuncName;
  char *error;
  allocator local_341;
  undefined1 local_340 [8];
  string err;
  LibraryHandle lib;
  string local_310;
  undefined1 local_2f0 [8];
  ostringstream e;
  allocator local_171;
  string local_170;
  undefined1 local_150 [8];
  string fullPath;
  string exp;
  undefined1 local_108 [4];
  uint j;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  string local_80 [8];
  string moduleName;
  allocator local_49;
  undefined1 local_48 [8];
  string reportVar;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmLoadCommandCommand *this_local;
  
  reportVar.field_2._8_8_ = param_2;
  bVar3 = cmCommand::Disallowed
                    (&this->super_cmCommand,CMP0031,
                     "The load_command command should not be called; see CMP0031.");
  if (bVar3) {
    this_local._7_1_ = true;
  }
  else {
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar4 == 0) {
      this_local._7_1_ = true;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_48,"CMAKE_LOADED_COMMAND_",&local_49);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,0);
      std::__cxx11::string::operator+=((string *)local_48,(string *)pvVar5);
      cmMakefile::RemoveDefinition((this->super_cmCommand).Makefile,(string *)local_48);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a0,"CMAKE_SHARED_MODULE_PREFIX",&local_a1);
      pcVar6 = cmMakefile::GetRequiredDefinition(pcVar1,&local_a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,pcVar6,&local_a2);
      std::allocator<char>::~allocator((allocator<char> *)&local_a2);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,0);
      std::operator+(&local_c8,"cm",pvVar5);
      std::__cxx11::string::operator+=(local_80,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_e8,"CMAKE_SHARED_MODULE_SUFFIX",
                 (allocator *)
                 ((long)&path.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      pcVar6 = cmMakefile::GetRequiredDefinition(pcVar1,&local_e8);
      std::__cxx11::string::operator+=(local_80,pcVar6);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&path.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_108);
      exp.field_2._12_4_ = 1;
      while( true ) {
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(args);
        if (sVar4 <= (uint)exp.field_2._12_4_) break;
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)(uint)exp.field_2._12_4_);
        std::__cxx11::string::string((string *)(fullPath.field_2._M_local_buf + 8),(string *)pvVar5)
        ;
        cmSystemTools::ExpandRegistryValues
                  ((string *)((long)&fullPath.field_2 + 8),KeyWOW64_Default);
        cmSystemTools::GlobDirs
                  ((string *)((long)&fullPath.field_2 + 8),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_108);
        std::__cxx11::string::~string((string *)(fullPath.field_2._M_local_buf + 8));
        exp.field_2._12_4_ = exp.field_2._12_4_ + 1;
      }
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_170,pcVar6,&local_171);
      cmsys::SystemTools::FindFile
                ((string *)local_150,&local_170,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_108,false);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_150,"");
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f0);
        poVar7 = std::operator<<((ostream *)local_2f0,"Attempt to load command failed from file \"")
        ;
        poVar7 = std::operator<<(poVar7,local_80);
        std::operator<<(poVar7,"\"");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,&local_310);
        std::__cxx11::string::~string((string *)&local_310);
        this_local._7_1_ = false;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f0);
      }
      else {
        pcVar6 = (char *)std::__cxx11::string::c_str();
        err.field_2._8_8_ = cmDynamicLoader::OpenLibrary(pcVar6);
        if ((LibraryHandle)err.field_2._8_8_ == (LibraryHandle)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_340,"Attempt to load the library ",&local_341);
          std::allocator<char>::~allocator((allocator<char> *)&local_341);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_150," failed.");
          std::__cxx11::string::operator+=((string *)local_340,(string *)&error);
          std::__cxx11::string::~string((string *)&error);
          initFuncName.field_2._8_8_ = cmsys::DynamicLoader::LastError();
          if ((char *)initFuncName.field_2._8_8_ != (char *)0x0) {
            std::__cxx11::string::operator+=((string *)local_340," Additional error info is:\n");
            std::__cxx11::string::operator+=((string *)local_340,(char *)initFuncName.field_2._8_8_)
            ;
          }
          cmCommand::SetError(&this->super_cmCommand,(string *)local_340);
          this_local._7_1_ = false;
          std::__cxx11::string::~string((string *)local_340);
        }
        else {
          pcVar1 = (this->super_cmCommand).Makefile;
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmMakefile::AddDefinition(pcVar1,(string *)local_48,pcVar6);
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &initFunction,pvVar5,"Init");
          uVar2 = err.field_2._8_8_;
          pcVar6 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_3b8,pcVar6,&local_3b9);
          p_Var8 = cmsys::DynamicLoader::GetSymbolAddress((LibraryHandle)uVar2,&local_3b8);
          std::__cxx11::string::~string((string *)&local_3b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
          local_398 = p_Var8;
          if (p_Var8 == (SymbolPointer)0x0) {
            std::__cxx11::string::operator=((string *)&initFunction,"_");
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,0);
            std::__cxx11::string::operator+=((string *)&initFunction,(string *)pvVar5);
            std::__cxx11::string::operator+=((string *)&initFunction,"Init");
            uVar2 = err.field_2._8_8_;
            pcVar6 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_3e0,pcVar6,(allocator *)((long)&f + 7));
            local_398 = cmsys::DynamicLoader::GetSymbolAddress((LibraryHandle)uVar2,&local_3e0);
            std::__cxx11::string::~string((string *)&local_3e0);
            std::allocator<char>::~allocator((allocator<char> *)((long)&f + 7));
          }
          bVar3 = local_398 == (SymbolPointer)0x0;
          if (bVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_410,
                       "Attempt to load command failed. No init function found.",&local_411);
            cmCommand::SetError(&this->super_cmCommand,&local_410);
            std::__cxx11::string::~string((string *)&local_410);
            std::allocator<char>::~allocator((allocator<char> *)&local_411);
          }
          else {
            this_00 = (cmLoadedCommand *)operator_new(0xb0);
            cmLoadedCommand::cmLoadedCommand(this_00);
            local_3f0 = this_00;
            (*local_398)(&this_00->info);
            this_01 = cmMakefile::GetState((this->super_cmCommand).Makefile);
            cmState::AddCommand(this_01,&local_3f0->super_cmCommand);
          }
          this_local._7_1_ = !bVar3;
          std::__cxx11::string::~string((string *)&initFunction);
        }
      }
      std::__cxx11::string::~string((string *)local_150);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_108);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string((string *)local_48);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmLoadCommandCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(this->Disallowed(cmPolicies::CMP0031,
      "The load_command command should not be called; see CMP0031."))
    { return true; }
  if(args.size() < 1 )
    {
    return true;
    }

  // Construct a variable to report what file was loaded, if any.
  // Start by removing the definition in case of failure.
  std::string reportVar = "CMAKE_LOADED_COMMAND_";
  reportVar += args[0];
  this->Makefile->RemoveDefinition(reportVar);

  // the file must exist
  std::string moduleName =
    this->Makefile->GetRequiredDefinition("CMAKE_SHARED_MODULE_PREFIX");
  moduleName += "cm" + args[0];
  moduleName +=
    this->Makefile->GetRequiredDefinition("CMAKE_SHARED_MODULE_SUFFIX");

  // search for the file
  std::vector<std::string> path;
  for (unsigned int j = 1; j < args.size(); j++)
    {
    // expand variables
    std::string exp = args[j];
    cmSystemTools::ExpandRegistryValues(exp);

    // Glob the entry in case of wildcards.
    cmSystemTools::GlobDirs(exp, path);
    }

  // Try to find the program.
  std::string fullPath = cmSystemTools::FindFile(moduleName.c_str(), path);
  if (fullPath == "")
    {
    std::ostringstream e;
    e << "Attempt to load command failed from file \""
      << moduleName << "\"";
    this->SetError(e.str());
    return false;
    }

  // try loading the shared library / dll
  cmsys::DynamicLoader::LibraryHandle lib
    = cmDynamicLoader::OpenLibrary(fullPath.c_str());
  if(!lib)
    {
    std::string err = "Attempt to load the library ";
    err += fullPath + " failed.";
    const char* error = cmsys::DynamicLoader::LastError();
    if ( error )
      {
      err += " Additional error info is:\n";
      err += error;
      }
    this->SetError(err);
    return false;
    }

  // Report what file was loaded for this command.
  this->Makefile->AddDefinition(reportVar, fullPath.c_str());

  // find the init function
  std::string initFuncName = args[0] + "Init";
  CM_INIT_FUNCTION initFunction
    = (CM_INIT_FUNCTION)
    cmsys::DynamicLoader::GetSymbolAddress(lib, initFuncName.c_str());
  if ( !initFunction )
    {
    initFuncName = "_";
    initFuncName += args[0];
    initFuncName += "Init";
    initFunction = (CM_INIT_FUNCTION)(
      cmsys::DynamicLoader::GetSymbolAddress(lib, initFuncName.c_str()));
    }
  // if the symbol is found call it to set the name on the
  // function blocker
  if(initFunction)
    {
    // create a function blocker and set it up
    cmLoadedCommand *f = new cmLoadedCommand();
    (*initFunction)(&f->info);
    this->Makefile->GetState()->AddCommand(f);
    return true;
    }
  this->SetError("Attempt to load command failed. "
                 "No init function found.");
  return false;
}